

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scfx_rep.cpp
# Opt level: O2

void __thiscall sc_dt::scfx_rep::scfx_rep(scfx_rep *this,sc_unsigned *a)

{
  uint *puVar1;
  bool bVar2;
  int iVar3;
  sc_unsigned_bitref_r *this_00;
  uint64 uVar4;
  scfx_index sVar5;
  int i;
  
  scfx_mant::scfx_mant(&this->m_mant,4);
  this->m_wp = 0;
  this->m_sign = 0;
  this->m_state = normal;
  this->m_msw = 0;
  *(undefined8 *)((long)&this->m_msw + 1) = 0;
  bVar2 = sc_unsigned::iszero(a);
  if (bVar2) {
    set_zero(this,1);
  }
  else {
    iVar3 = (a->nbits + 0x1e) / 0x20;
    if ((this->m_mant).m_size < iVar3) {
      scfx_mant::resize_to(&this->m_mant,iVar3,0);
    }
    scfx_mant::clear(&this->m_mant);
    this->m_wp = 0;
    this->m_state = normal;
    for (iVar3 = 0; iVar3 < a->nbits + -1; iVar3 = iVar3 + 1) {
      this_00 = sc_unsigned::operator[](a,iVar3);
      uVar4 = sc_unsigned_bitref_r::operator_cast_to_unsigned_long_long(this_00);
      if (uVar4 != 0) {
        sVar5 = calc_indices(this,iVar3);
        puVar1 = (this->m_mant).m_array + sVar5.m_wi;
        *puVar1 = *puVar1 | 1 << ((byte)sVar5.m_bi & 0x1f);
      }
    }
    this->m_sign = 1;
    find_sw(this);
  }
  return;
}

Assistant:

scfx_rep::scfx_rep( const sc_unsigned& a )
: m_mant( min_mant ), m_wp(), m_sign(), m_state(), m_msw(), m_lsw(),
  m_r_flag( false )
{
    if( a.iszero() )
	set_zero();
    else
    {
	int words = n_word( a.length() );
	if( words > size() )
	    resize_to( words );
	m_mant.clear();
	m_wp = 0;
	m_state = normal;
	for( int i = 0; i < a.length(); ++ i )
	{
	    if( a[i] )
	    {
		scfx_index x = calc_indices( i );
		m_mant[x.wi()] |= 1 << x.bi();
	    }
	}
	m_sign = 1;
	find_sw();
    }
}